

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InlinePass::AddLoopMerge
          (InlinePass *this,uint32_t merge_id,uint32_t continue_id,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *block_ptr)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<spvtools::opt::Operand> __l;
  Instruction *this_00;
  IRContext *c;
  pointer this_01;
  Operand *local_1b0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1a8
  ;
  allocator<spvtools::opt::Operand> local_19d;
  uint local_19c;
  iterator local_198;
  undefined8 local_190;
  SmallVector<unsigned_int,_2UL> local_188;
  uint32_t local_15c;
  iterator local_158;
  undefined8 local_150;
  SmallVector<unsigned_int,_2UL> local_148;
  uint32_t local_11c;
  iterator local_118;
  undefined8 local_110;
  SmallVector<unsigned_int,_2UL> local_108;
  Operand local_e0;
  Operand OStack_b0;
  Operand OStack_80;
  iterator local_50;
  _func_int **local_48;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_40;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_28;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  newLoopMerge;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  *block_ptr_local;
  uint32_t continue_id_local;
  uint32_t merge_id_local;
  InlinePass *this_local;
  
  newLoopMerge._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )block_ptr;
  this_00 = (Instruction *)::operator_new(0x70);
  c = Pass::context(&this->super_Pass);
  local_118 = &local_11c;
  local_110 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_118;
  local_11c = merge_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_108,init_list_01);
  Operand::Operand(&local_e0,SPV_OPERAND_TYPE_ID,&local_108);
  local_158 = &local_15c;
  local_150 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_158;
  local_15c = continue_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_148,init_list_00);
  Operand::Operand(&OStack_b0,SPV_OPERAND_TYPE_ID,&local_148);
  local_19c = 0;
  local_198 = &local_19c;
  local_190 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_198;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_188,init_list);
  Operand::Operand(&OStack_80,SPV_OPERAND_TYPE_LOOP_CONTROL,&local_188);
  local_50 = &local_e0;
  local_48 = (_func_int **)0x3;
  std::allocator<spvtools::opt::Operand>::allocator(&local_19d);
  __l._M_len = (size_type)local_48;
  __l._M_array = local_50;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_40,__l,&local_19d);
  opt::Instruction::Instruction(this_00,c,OpLoopMerge,0,0,&local_40);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_28,this_00);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_40);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_19d);
  local_1b0 = (Operand *)&local_50;
  do {
    local_1b0 = local_1b0 + -1;
    Operand::~Operand(local_1b0);
  } while (local_1b0 != &local_e0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_188);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_148);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_108);
  this_01 = std::
            unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
            operator->((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        *)newLoopMerge._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  unique_ptr(&local_1a8,&local_28);
  BasicBlock::AddInstruction(this_01,&local_1a8);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_1a8);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_28);
  return;
}

Assistant:

void InlinePass::AddLoopMerge(uint32_t merge_id, uint32_t continue_id,
                              std::unique_ptr<BasicBlock>* block_ptr) {
  std::unique_ptr<Instruction> newLoopMerge(new Instruction(
      context(), spv::Op::OpLoopMerge, 0, 0,
      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {merge_id}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {continue_id}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LOOP_CONTROL, {0}}}));
  (*block_ptr)->AddInstruction(std::move(newLoopMerge));
}